

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O1

float compute_weight_multiplier(warm_cb *data,size_t i,int ec_type)

{
  float fVar1;
  float fVar2;
  
  fVar1 = (data->lambdas).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[i];
  fVar2 = 1.0 - fVar1;
  if (ec_type != 1) {
    fVar2 = fVar1;
  }
  return (((float)data->ws_train_size + (float)data->inter_period) * fVar2) /
         ((float)data->ws_train_size * (1.0 - fVar1) + (float)data->inter_period * fVar1 +
         1.1754944e-38);
}

Assistant:

float compute_weight_multiplier(warm_cb& data, size_t i, int ec_type)
{
	float weight_multiplier;
	float ws_train_size = data.ws_train_size;
	float inter_train_size = data.inter_period;
	float total_train_size = ws_train_size + inter_train_size;
	float total_weight = (1-data.lambdas[i]) * ws_train_size + data.lambdas[i] * inter_train_size;

	if (ec_type == WARM_START)
		weight_multiplier = (1-data.lambdas[i]) * total_train_size / (total_weight + FLT_MIN);
	else
		weight_multiplier = data.lambdas[i] * total_train_size / (total_weight + FLT_MIN);

	return weight_multiplier;
}